

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O0

void __thiscall gl4cts::BufferStorageTest::deinit(BufferStorageTest *this)

{
  bool bVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  reference ppBVar4;
  __normal_iterator<gl4cts::BufferStorageTestCase_**,_std::vector<gl4cts::BufferStorageTestCase_*,_std::allocator<gl4cts::BufferStorageTestCase_*>_>_>
  local_28;
  __normal_iterator<gl4cts::BufferStorageTestCase_**,_std::vector<gl4cts::BufferStorageTestCase_*,_std::allocator<gl4cts::BufferStorageTestCase_*>_>_>
  local_20;
  TestCasesVectorIterator itTestCase;
  Functions *gl;
  BufferStorageTest *this_local;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  itTestCase._M_current = (BufferStorageTestCase **)CONCAT44(extraout_var,iVar2);
  local_20._M_current =
       (BufferStorageTestCase **)
       std::
       vector<gl4cts::BufferStorageTestCase_*,_std::allocator<gl4cts::BufferStorageTestCase_*>_>::
       begin(&this->m_testCases);
  while( true ) {
    local_28._M_current =
         (BufferStorageTestCase **)
         std::
         vector<gl4cts::BufferStorageTestCase_*,_std::allocator<gl4cts::BufferStorageTestCase_*>_>::
         end(&this->m_testCases);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    ppBVar4 = __gnu_cxx::
              __normal_iterator<gl4cts::BufferStorageTestCase_**,_std::vector<gl4cts::BufferStorageTestCase_*,_std::allocator<gl4cts::BufferStorageTestCase_*>_>_>
              ::operator*(&local_20);
    (*(*ppBVar4)->_vptr_BufferStorageTestCase[2])();
    ppBVar4 = __gnu_cxx::
              __normal_iterator<gl4cts::BufferStorageTestCase_**,_std::vector<gl4cts::BufferStorageTestCase_*,_std::allocator<gl4cts::BufferStorageTestCase_*>_>_>
              ::operator*(&local_20);
    if (*ppBVar4 != (BufferStorageTestCase *)0x0) {
      (*(*ppBVar4)->_vptr_BufferStorageTestCase[1])();
    }
    __gnu_cxx::
    __normal_iterator<gl4cts::BufferStorageTestCase_**,_std::vector<gl4cts::BufferStorageTestCase_*,_std::allocator<gl4cts::BufferStorageTestCase_*>_>_>
    ::operator++(&local_20);
  }
  std::vector<gl4cts::BufferStorageTestCase_*,_std::allocator<gl4cts::BufferStorageTestCase_*>_>::
  clear(&this->m_testCases);
  if (this->m_sparse_bo != 0) {
    (*(code *)itTestCase._M_current[0x87])(1,&this->m_sparse_bo);
    this->m_sparse_bo = 0;
  }
  return;
}

Assistant:

void BufferStorageTest::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* De-initialize all test the test cases */
	for (TestCasesVectorIterator itTestCase = m_testCases.begin(); itTestCase != m_testCases.end(); ++itTestCase)
	{
		(*itTestCase)->deinitTestCaseGlobal();

		delete (*itTestCase);
	} /* for (all registered test case objects) */

	m_testCases.clear();

	if (m_sparse_bo != 0)
	{
		gl.deleteBuffers(1, &m_sparse_bo);

		m_sparse_bo = 0;
	}
}